

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int xferCompatibleIndex(Index *pDest,Index *pSrc)

{
  ushort uVar1;
  i16 *piVar2;
  i16 *piVar3;
  char *zRight;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = pDest->nKeyCol;
  uVar5 = 0;
  if ((uVar1 == pSrc->nKeyCol) && (pDest->onError == pSrc->onError)) {
    if ((ulong)uVar1 != 0) {
      piVar2 = pSrc->aiColumn;
      piVar3 = pDest->aiColumn;
      uVar6 = 0;
      do {
        if (piVar2[uVar6] != piVar3[uVar6]) {
          return 0;
        }
        if ((piVar2[uVar6] == -2) &&
           (iVar4 = sqlite3ExprCompare(pSrc->aColExpr->a[uVar6].pExpr,
                                       pDest->aColExpr->a[uVar6].pExpr,-1), iVar4 != 0)) {
          return 0;
        }
        if (pSrc->aSortOrder[uVar6] != pDest->aSortOrder[uVar6]) {
          return 0;
        }
        zRight = pDest->azColl[uVar6];
        if (pSrc->azColl[uVar6] == (char *)0x0) {
          iVar4 = -(uint)(zRight != (char *)0x0);
        }
        else {
          if (zRight == (char *)0x0) {
            return 0;
          }
          iVar4 = sqlite3StrICmp(pSrc->azColl[uVar6],zRight);
        }
        if (iVar4 != 0) {
          return 0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar1);
    }
    iVar4 = sqlite3ExprCompare(pSrc->pPartIdxWhere,pDest->pPartIdxWhere,-1);
    uVar5 = (uint)(iVar4 == 0);
  }
  return uVar5;
}

Assistant:

static int xferCompatibleIndex(Index *pDest, Index *pSrc){
  int i;
  assert( pDest && pSrc );
  assert( pDest->pTable!=pSrc->pTable );
  if( pDest->nKeyCol!=pSrc->nKeyCol ){
    return 0;   /* Different number of columns */
  }
  if( pDest->onError!=pSrc->onError ){
    return 0;   /* Different conflict resolution strategies */
  }
  for(i=0; i<pSrc->nKeyCol; i++){
    if( pSrc->aiColumn[i]!=pDest->aiColumn[i] ){
      return 0;   /* Different columns indexed */
    }
    if( pSrc->aiColumn[i]==XN_EXPR ){
      assert( pSrc->aColExpr!=0 && pDest->aColExpr!=0 );
      if( sqlite3ExprCompare(pSrc->aColExpr->a[i].pExpr,
                             pDest->aColExpr->a[i].pExpr, -1)!=0 ){
        return 0;   /* Different expressions in the index */
      }
    }
    if( pSrc->aSortOrder[i]!=pDest->aSortOrder[i] ){
      return 0;   /* Different sort orders */
    }
    if( sqlite3_stricmp(pSrc->azColl[i],pDest->azColl[i])!=0 ){
      return 0;   /* Different collating sequences */
    }
  }
  if( sqlite3ExprCompare(pSrc->pPartIdxWhere, pDest->pPartIdxWhere, -1) ){
    return 0;     /* Different WHERE clauses */
  }

  /* If no test above fails then the indices must be compatible */
  return 1;
}